

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O3

QByteArray *
qdtoAscii(QByteArray *__return_storage_ptr__,double d,DoubleForm form,int precision,bool uppercase)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *data;
  DoubleForm DVar3;
  uint uVar4;
  uint uVar5;
  size_t __size;
  char *pcVar6;
  iterator pcVar7;
  int precision_00;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  qsizetype qVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  qsizetype i;
  DoubleForm DVar15;
  int iVar16;
  size_t allocSize;
  size_t allocSize_00;
  long in_FS_OFFSET;
  bool bVar17;
  ulong uVar18;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  QByteArrayView data_03;
  QByteArrayView data_04;
  QByteArrayView data_05;
  QByteArrayView data_06;
  QByteArrayView data_07;
  int length;
  bool negative;
  char *local_1f0;
  QByteArray local_1c8;
  int local_1a4;
  int local_1a0;
  bool local_199;
  char local_198 [328];
  size_t local_50;
  size_t local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 6;
  if (-1 < precision) {
    uVar8 = (ulong)(uint)precision;
  }
  if (precision == -0x80) {
    uVar8 = 0xffffff80;
  }
  precision_00 = (int)uVar8;
  iVar10 = 0x12;
  if (precision_00 != -0x80) {
    if ((ulong)ABS(d) < 0x7ff0000000000000 && form == DFDecimal) {
      uVar18 = -(ulong)(d < -d);
      iVar10 = precision_00 + 0x136;
      if ((double)(~uVar18 & (ulong)d | (ulong)-d & uVar18) <= 524288.0) {
        iVar10 = precision_00 + 7;
      }
    }
    else {
      iVar10 = 2;
      if (2 < precision_00) {
        iVar10 = precision_00;
      }
      iVar10 = iVar10 + 2;
    }
  }
  pcVar6 = local_198;
  memset(pcVar6,0xaa,0x148);
  allocSize_00 = (size_t)iVar10;
  local_50 = 0x143;
  local_48 = 0;
  if (0x143 < iVar10) {
    local_50 = allocSize_00;
    local_40 = pcVar6;
    __size = QtPrivate::expectedAllocSize(allocSize_00,0x10);
    if (__size == 0) {
      __size = allocSize_00;
    }
    pcVar6 = (char *)malloc(__size);
    local_50 = __size;
  }
  local_199 = false;
  local_1a0 = 0;
  local_1a4 = 0;
  local_48 = allocSize_00;
  local_40 = pcVar6;
  qt_doubleToAscii(d,form,precision_00,pcVar6,allocSize_00,&local_199,&local_1a0,&local_1a4);
  local_1f0 = local_40;
  bVar17 = local_199;
  iVar10 = local_1a0;
  lVar14 = (long)local_1a0;
  uVar18 = (ulong)local_199;
  lVar13 = lVar14 + uVar18;
  DVar3 = form;
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    if (form == DFSignificantDigits) {
      DVar3 = resolveFormat(precision_00,local_1a4,lVar14);
    }
    if (DVar3 == DFDecimal) {
      if (local_1a4 < 1) {
        uVar9 = (ulong)(2 - local_1a4);
      }
      else {
        uVar9 = 1;
        if (iVar10 <= local_1a4) {
          uVar9 = (ulong)(local_1a4 - iVar10);
        }
      }
      lVar13 = lVar13 + uVar9;
      DVar15 = DFDecimal;
      DVar3 = DFDecimal;
      if (0 < precision_00 && form != DFSignificantDigits) {
        if (local_1a4 < iVar10) {
          uVar4 = (precision_00 - iVar10) + local_1a4;
          uVar5 = 0;
          if (0 < (int)uVar4) {
            uVar5 = uVar4;
          }
          uVar8 = (ulong)uVar5;
          goto LAB_00158c1e;
        }
        lVar13 = lVar13 + uVar8 + 1;
      }
    }
    else if (DVar3 == DFExponent) {
      uVar4 = local_1a4 - 1;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (uVar5 < 1000) {
        uVar4 = 1;
        if (9 < uVar5) {
          uVar4 = 3 - (uVar5 < 100);
        }
      }
      else {
        qdtoAscii();
        uVar4 = (uint)local_1c8.d.d;
      }
      uVar9 = 2;
      if (2 < (int)uVar4) {
        uVar9 = (ulong)uVar4;
      }
      uVar5 = (precision_00 - iVar10) + 1;
      DVar15 = DFExponent;
      uVar8 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar8 = 0;
      }
      if (form == DFSignificantDigits) {
        uVar8 = 0;
      }
      lVar13 = lVar13 + 3 + uVar9;
LAB_00158c1e:
      lVar13 = lVar13 + uVar8;
      DVar3 = DVar15;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  qVar11 = 0;
  if (0 < lVar13) {
    qVar11 = lVar13;
  }
  QByteArray::reallocData(__return_storage_ptr__,qVar11,KeepSize);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (d != 0.0 && bVar17 == true) {
    QByteArray::append(__return_storage_ptr__,'-');
  }
  iVar16 = local_1a4;
  if (0x7fefffffffffffff < (ulong)ABS(d)) {
    data_02.m_data = local_1f0;
    data_02.m_size = lVar14;
    QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_02);
    if (uppercase) {
      QByteArray::toUpper_helper(&local_1c8,__return_storage_ptr__);
      data = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar6 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_1c8.d.d;
      (__return_storage_ptr__->d).ptr = local_1c8.d.ptr;
      qVar11 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_1c8.d.size;
      local_1c8.d.d = (Data *)data;
      local_1c8.d.ptr = pcVar6;
      local_1c8.d.size = qVar11;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
    }
    goto LAB_0015906f;
  }
  if (DVar3 != DFDecimal) {
    if (DVar3 == DFExponent) {
      data_00.m_data = local_1f0;
      data_00.m_size = 1;
      QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_00);
      lVar14 = lVar14 + -1;
      if (0 < precision_00 && form != DFSignificantDigits || lVar14 != 0) {
        QByteArray::append(__return_storage_ptr__,'.');
        data_01.m_data = local_1f0 + 1;
        data_01.m_size = lVar14;
        QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_01);
        if ((form != DFSignificantDigits) && (lVar14 = precision_00 - lVar14, 0 < lVar14)) {
          do {
            QByteArray::append(__return_storage_ptr__,'0');
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
      }
      iVar10 = local_1a4;
      uVar5 = local_1a4 - 1;
      QByteArray::append(__return_storage_ptr__,!uppercase << 5 | 0x45);
      QByteArray::append(__return_storage_ptr__,(iVar10 < 1) * '\x02' + '+');
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if (uVar4 < 1000) {
        iVar10 = 3 - (uint)(uVar4 < 100);
        if (uVar4 < 10) {
          QByteArray::append(__return_storage_ptr__,'0');
          iVar10 = 1;
        }
      }
      else {
        qdtoAscii();
        iVar10 = (uint)local_1c8.d.d;
      }
      QByteArray::resize(__return_storage_ptr__,(long)iVar10 + (__return_storage_ptr__->d).size);
      pcVar7 = QByteArray::begin(__return_storage_ptr__);
      pbVar12 = (byte *)(pcVar7 + (__return_storage_ptr__->d).size);
      uVar8 = (ulong)uVar4;
      do {
        pbVar12 = pbVar12 + -1;
        *pbVar12 = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
        bVar17 = 9 < uVar8;
        uVar8 = uVar8 / 10;
      } while (bVar17);
    }
    goto LAB_0015906f;
  }
  lVar13 = (long)local_1a4;
  if (lVar13 < 0) {
    data_04.m_data = "0.0";
    data_04.m_size = 3;
    QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_04);
    if (iVar16 != -1) {
      iVar16 = iVar16 + 1;
      do {
        QByteArray::append(__return_storage_ptr__,'0');
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0);
    }
    data_05.m_data = local_1f0;
    data_05.m_size = lVar14;
    QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_05);
    if (form != DFSignificantDigits) {
      for (lVar13 = ((__return_storage_ptr__->d).size - uVar18) + -2; lVar13 < precision_00;
          lVar13 = lVar13 + 1) {
        QByteArray::append(__return_storage_ptr__,'0');
      }
    }
    goto LAB_0015906f;
  }
  if (iVar10 < local_1a4) {
    data_03.m_data = local_1f0;
    data_03.m_size = lVar14;
    QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_03);
    if ((ulong)(__return_storage_ptr__->d).size < lVar13 + uVar18) {
      local_1f0 = (char *)0x0;
      do {
        QByteArray::append(__return_storage_ptr__,'0');
      } while ((ulong)(__return_storage_ptr__->d).size < lVar13 + uVar18);
    }
    else {
      local_1f0 = (char *)0x0;
    }
LAB_00159014:
    if (precision_00 < 1 || form == DFSignificantDigits) goto LAB_0015906f;
    lVar14 = 0;
  }
  else {
    if (local_1a4 == 0) {
      QByteArray::append(__return_storage_ptr__,'0');
    }
    else {
      data_06.m_data = local_1f0;
      data_06.m_size = lVar13;
      QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_06);
      local_1f0 = local_1f0 + lVar13;
      lVar14 = lVar14 - lVar13;
    }
    if (lVar14 == 0) goto LAB_00159014;
  }
  QByteArray::append(__return_storage_ptr__,'.');
  data_07.m_data = local_1f0;
  data_07.m_size = lVar14;
  QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_07);
  if ((form != DFSignificantDigits) &&
     (lVar13 = precision_00 - lVar14, lVar13 != 0 && lVar14 <= precision_00)) {
    do {
      QByteArray::append(__return_storage_ptr__,'0');
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
LAB_0015906f:
  if (local_40 != local_198) {
    QtPrivate::sizedFree(local_40,local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray qdtoAscii(double d, QLocaleData::DoubleForm form, int precision, bool uppercase)
{
    return dtoString<QByteArray>(d, form, precision, uppercase);
}